

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O1

void blowfish_ssh1_decrypt_blk(ssh_cipher *cipher,void *blk,int len)

{
  uint32_t uVar1;
  uint uVar2;
  uint8_t *p;
  int iVar3;
  uint32_t xL;
  uint32_t xR;
  uint32_t uVar4;
  uint uVar5;
  uint32_t out [2];
  uint local_48;
  uint local_44;
  ssh_cipher *local_40;
  BlowfishContext *local_38;
  
  if ((len & 7U) != 0) {
    __assert_fail("(len & 7) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/blowfish.c"
                  ,0x161,"void blowfish_lsb_decrypt_cbc(unsigned char *, int, BlowfishContext *)");
  }
  xL = *(uint32_t *)&cipher[-1].vt;
  xR = *(uint32_t *)((long)&cipher[-1].vt + 4);
  local_40 = cipher;
  if (0 < len) {
    local_38 = (BlowfishContext *)(cipher + -0x20a);
    iVar3 = len + 8;
    uVar1 = xL;
    uVar4 = xR;
    do {
      xL = *blk;
      xR = *(uint32_t *)((long)blk + 4);
      blowfish_decrypt(xL,xR,&local_48,local_38);
      uVar2 = uVar1 ^ local_48;
      uVar5 = uVar4 ^ local_44;
      *(char *)blk = (char)uVar2;
      *(char *)((long)blk + 1) = (char)(uVar2 >> 8);
      *(char *)((long)blk + 2) = (char)(uVar2 >> 0x10);
      *(char *)((long)blk + 3) = (char)(uVar2 >> 0x18);
      *(char *)((long)blk + 4) = (char)uVar5;
      *(char *)((long)blk + 5) = (char)(uVar5 >> 8);
      *(char *)((long)blk + 6) = (char)(uVar5 >> 0x10);
      *(char *)((long)blk + 7) = (char)(uVar5 >> 0x18);
      blk = (void *)((long)blk + 8);
      iVar3 = iVar3 + -8;
      uVar1 = xL;
      uVar4 = xR;
    } while (8 < iVar3);
  }
  *(uint32_t *)&local_40[-1].vt = xL;
  *(uint32_t *)((long)&local_40[-1].vt + 4) = xR;
  return;
}

Assistant:

static void blowfish_ssh1_decrypt_blk(ssh_cipher *cipher, void *blk, int len)
{
    struct blowfish_ctx *ctx = container_of(cipher, struct blowfish_ctx, ciph);
    blowfish_lsb_decrypt_cbc(blk, len, &ctx->context);
}